

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdFreeMultisigScriptHandle(void *handle,void *multisig_handle)

{
  CfdException *except;
  exception *std_except;
  allocator local_49;
  string local_48 [28];
  uint32_t in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"MultisigScript",&local_49);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return 0;
}

Assistant:

int CfdFreeMultisigScriptHandle(void* handle, void* multisig_handle) {
  try {
    cfd::Initialize();
    FreeBuffer(
        multisig_handle, kPrefixMultisigScript, sizeof(CfdCapiMultisigScript));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}